

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
rec_equal<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,boost::container::flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>,std::less<short>,void>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          Siblings *s1,
          Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
          *s2)

{
  short sVar1;
  short sVar2;
  short sVar3;
  pointer __s1;
  pointer piVar4;
  void *__s2;
  bool bVar5;
  int iVar6;
  size_t __n;
  pointer ppVar7;
  pointer ppVar8;
  
  if ((s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size ==
      (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_size) {
    bVar5 = true;
    if ((s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size != 0) {
      ppVar8 = (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      ppVar7 = (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      do {
        if (ppVar7 == (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                      (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_size) break;
        sVar1 = ppVar8->first;
        sVar2 = ppVar7->first;
        if (sVar1 != sVar2) goto LAB_0012a7ac;
        __s1 = *(pointer *)&(ppVar8->second).super_Filtration_simplex_base.filt_;
        piVar4 = *(pointer *)((long)&(ppVar8->second).super_Filtration_simplex_base + 8);
        __n = (long)piVar4 - (long)__s1;
        __s2 = *(void **)&(ppVar7->second).super_Filtration_simplex_base.filt_;
        if (__n != (long)*(pointer *)((long)&(ppVar7->second).super_Filtration_simplex_base + 8) -
                   (long)__s2) goto LAB_0012a7ac;
        if (piVar4 != __s1) {
          iVar6 = bcmp(__s1,__s2,__n);
          if (iVar6 != 0) goto LAB_0012a7ac;
        }
        sVar3 = ((ppVar8->second).children_)->parent_;
        if ((((ppVar7->second).children_)->parent_ == sVar2) != (sVar3 == sVar1)) goto LAB_0012a7ac;
        if (sVar3 == sVar1) {
          bVar5 = rec_equal<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,boost::container::flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>,std::less<short>,void>>>
                            (this,(ppVar8->second).children_,(ppVar7->second).children_);
          if (!bVar5) goto LAB_0012a7ac;
        }
        ppVar8 = ppVar8 + 1;
        ppVar7 = ppVar7 + 1;
      } while (ppVar8 != (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                         (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size);
      bVar5 = true;
    }
  }
  else {
LAB_0012a7ac:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool rec_equal(Siblings const* s1, OtherSiblings const* s2) const {
    if (s1->members().size() != s2->members().size())
      return false;
    auto sh2 = s2->members().begin();
    for (auto sh1 = s1->members().begin();
         (sh1 != s1->members().end() && sh2 != s2->members().end());
         ++sh1, ++sh2) {
      if (sh1->first != sh2->first || !(sh1->second.filtration() == sh2->second.filtration()))
        return false;
      if (has_children(sh1) != has_children(sh2))
        return false;
      // Recursivity on children only if both have children
      else if (has_children(sh1))
        if (!rec_equal(sh1->second.children(), sh2->second.children()))
          return false;
    }
    return true;
  }